

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_float32_primitive_asIEEEFloat32Decoded
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong uVar1;
  uint uVar2;
  
  if (argumentCount != 1) {
    sysbvm_error_argumentCountMismatch(1,argumentCount);
  }
  uVar1 = *arguments;
  if (uVar1 == 0 || (uVar1 & 0xf) != 0) {
    uVar2 = (uint)(uVar1 >> 4);
  }
  else {
    uVar2 = *(uint *)(uVar1 + 0x10);
  }
  return (ulong)uVar2 << 4 | 0xd;
}

Assistant:

static sysbvm_tuple_t sysbvm_float32_primitive_asIEEEFloat32Decoded(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 1) sysbvm_error_argumentCountMismatch(1, argumentCount);

    uint32_t uint32Value = sysbvm_tuple_uint32_decode(arguments[0]);
    float floatValue = 0;
    memcpy(&floatValue, &uint32Value, 4);

    return sysbvm_tuple_float32_encode(context, floatValue);
}